

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmhash.cpp
# Opt level: O0

void __thiscall
CVmHashTable::enum_entries(CVmHashTable *this,_func_void_void_ptr_CVmHashEntry_ptr *func,void *ctx)

{
  long lVar1;
  undefined8 in_RDX;
  code *in_RSI;
  undefined8 *in_RDI;
  CVmHashEntry *nxt;
  CVmHashEntry *entry;
  size_t i;
  CVmHashEntry **tableptr;
  long local_30;
  ulong local_28;
  long *local_20;
  
  local_20 = (long *)*in_RDI;
  for (local_28 = 0; local_28 < (ulong)in_RDI[1]; local_28 = local_28 + 1) {
    local_30 = *local_20;
    while (local_30 != 0) {
      lVar1 = *(long *)(local_30 + 8);
      (*in_RSI)(in_RDX,local_30);
      local_30 = lVar1;
    }
    local_20 = local_20 + 1;
  }
  return;
}

Assistant:

void CVmHashTable::enum_entries(void (*func)(void *, CVmHashEntry *),
                                void *ctx)
{
    CVmHashEntry **tableptr;
    size_t i;

    /* go through each hash value */
    for (tableptr = table_, i = 0 ; i < table_size_ ; ++i, ++tableptr)
    {
        CVmHashEntry *entry;
        CVmHashEntry *nxt;

        /* go through each entry at this hash value */
        for (entry = *tableptr ; entry ; entry = nxt)
        {
            /* 
             *   remember the next entry, in case the callback deletes the
             *   current entry 
             */
            nxt = entry->nxt_;

            /* invoke the callback on this entry */
            (*func)(ctx, entry);
        }
    }
}